

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O0

void fail_if_leftover_values(char *test_name)

{
  size_t sVar1;
  char *in_RDI;
  ListNode *unaff_retaddr;
  size_t in_stack_00000008;
  int error_occurred;
  char *in_stack_00000018;
  ListNode *in_stack_00000020;
  undefined4 in_stack_fffffffffffffff0;
  int quit_application;
  
  quit_application = 0;
  remove_always_return_values((ListNode *)test_name,in_stack_00000008);
  sVar1 = check_for_leftover_values(in_stack_00000020,in_stack_00000018,(size_t)test_name);
  if (sVar1 != 0) {
    quit_application = 1;
  }
  remove_always_return_values((ListNode *)test_name,in_stack_00000008);
  sVar1 = check_for_leftover_values(in_stack_00000020,in_stack_00000018,(size_t)test_name);
  if (sVar1 != 0) {
    quit_application = 1;
  }
  remove_always_return_values_from_list
            ((ListNode *)CONCAT44(quit_application,in_stack_fffffffffffffff0));
  sVar1 = check_for_leftover_values_list(unaff_retaddr,in_RDI);
  if (sVar1 != 0) {
    quit_application = 1;
  }
  if (quit_application != 0) {
    exit_test(quit_application);
  }
  return;
}

Assistant:

static void fail_if_leftover_values(const char *test_name) {
    int error_occurred = 0;
    (void)test_name;
    remove_always_return_values(&global_function_result_map_head, 1);
    if (check_for_leftover_values(
            &global_function_result_map_head,
            "%s() has remaining non-returned values.\n", 1)) {
        error_occurred = 1;
    }

    remove_always_return_values(&global_function_parameter_map_head, 2);
    if (check_for_leftover_values(
            &global_function_parameter_map_head,
            "'%s' parameter still has values that haven't been checked.\n",
            2)) {
        error_occurred = 1;
    }

    remove_always_return_values_from_list(&global_call_ordering_head);
    if (check_for_leftover_values_list(&global_call_ordering_head,
        "%s function was expected to be called but was not.\n")) {
        error_occurred = 1;
    }
    if (error_occurred) {
        exit_test(1);
    }
}